

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O1

TermList Kernel::SubstHelper::
         applyImpl<true,Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::DerefApplicator>
                   (TermList trm,DerefApplicator *applicator,bool noSharing)

{
  TermList TVar1;
  Entry *pEVar2;
  uint uVar3;
  TermList local_8;
  
  uVar3 = (uint)trm._content & 3;
  if (uVar3 == 3) {
    local_8._content = (uint64_t)((uint)trm._content | 3);
    pEVar2 = ::Lib::DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
             findEntry(&applicator->im->_derefBindings,&local_8);
    TVar1._content = (pEVar2->_val)._content;
  }
  else {
    if (uVar3 == 1) {
      TVar1 = Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::DerefApplicator::
              apply(applicator,(uint)(trm._content >> 2));
      return (TermList)TVar1._content;
    }
    TVar1._content =
         (uint64_t)
         applyImpl<true,Indexing::SubstitutionTree<Indexing::LiteralClause>::InstMatcher::DerefApplicator>
                   (trm._content,applicator,noSharing);
  }
  return (TermList)TVar1._content;
}

Assistant:

TermList SubstHelper::applyImpl(TermList trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm.isOrdinaryVar()) {
    return applicator.apply(trm.var());
  }
  else if(trm.isSpecialVar()) {
    return SpecVarHandler<ProcessSpecVars>::apply(applicator, trm.var());
  }
  else {
    ASS(trm.isTerm());
    return TermList(applyImpl<ProcessSpecVars>(trm.term(), applicator, noSharing));
  }
}